

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

uint8_t * get_prev_scanline(tgestate_t *state,uint8_t *addr)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 0x6e0;
  if (((ulong)(addr + (-0x30 - (long)state->speccy)) & 0xe0) == 0) {
    lVar2 = -0x20;
  }
  lVar1 = -0x100;
  if (((ulong)(addr + (-0x30 - (long)state->speccy)) & 0x700) == 0) {
    lVar1 = lVar2;
  }
  return addr + lVar1;
}

Assistant:

uint8_t *get_prev_scanline(tgestate_t *state, uint8_t *addr)
{
  uint8_t *const screen = &state->speccy->screen.pixels[0];
  ptrdiff_t      raddr = addr - screen;

  assert(state != NULL);
  assert(addr  != NULL);

  if ((raddr & 0x0700) != 0)
  {
    // NNN bits
    // Step back one scanline.
    raddr -= 256;
  }
  else
  {
    if ((raddr & 0x00FF) < 32)
      raddr -= 32;
    else
      // Complicated.
      raddr += 0x06E0;
  }

  return screen + raddr;
}